

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
MapLoader::loadMap_abi_cxx11_(MapLoader *this)

{
  void *this_00;
  bool bVar1;
  ostream *poVar2;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_01;
  undefined8 uVar3;
  istream *piVar4;
  long lVar5;
  bool local_48a;
  bool local_432;
  bool local_422;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  allocator local_371;
  string local_370 [8];
  string newNeighbor;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  int local_2b0;
  allocator local_2a9;
  int graphIndex;
  string nodeType;
  undefined1 local_280 [8];
  string nodeName;
  undefined1 local_258 [8];
  string line;
  ifstream input;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *graph;
  bool result;
  MapLoader *this_local;
  
  bVar1 = false;
  while (!bVar1) {
    bVar1 = fileIsValid(this);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Setting up the game board...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_01 = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x18);
      Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
                (this_01,this->nodeCount);
      this_00 = (void *)((long)&line.field_2 + 8);
      std::ifstream::ifstream(this_00);
      uVar3 = std::__cxx11::string::c_str();
      std::ifstream::open(this_00,uVar3,8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_258,"",(allocator *)(nodeName.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(nodeName.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_280,"",(allocator *)(nodeType.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(nodeType.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&graphIndex,"",&local_2a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      local_2b0 = 0;
      while( true ) {
        piVar4 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),(string *)local_258);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar1) break;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_258,"@node");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_280,"");
          std::__cxx11::string::operator=((string *)&graphIndex,"");
          std::operator>>((istream *)(line.field_2._M_local_buf + 8),(string *)local_258);
          std::operator>>((istream *)(line.field_2._M_local_buf + 8),(string *)local_258);
          while( true ) {
            piVar4 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),(string *)local_258)
            ;
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
            local_422 = false;
            if (bVar1) {
              local_422 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_258,"type:");
            }
            if (local_422 == false) break;
            std::operator+(&local_2f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_280,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258);
            std::operator+(&local_2d0,&local_2f0," ");
            std::__cxx11::string::operator=((string *)local_280,(string *)&local_2d0);
            std::__cxx11::string::~string((string *)&local_2d0);
            std::__cxx11::string::~string((string *)&local_2f0);
          }
          while( true ) {
            piVar4 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),(string *)local_258)
            ;
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
            local_432 = false;
            if (bVar1) {
              local_432 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_258,"adjacent:");
            }
            if (local_432 == false) break;
            std::operator+(&local_310,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &graphIndex,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258);
            std::__cxx11::string::operator=((string *)&graphIndex,(string *)&local_310);
            std::__cxx11::string::~string((string *)&local_310);
          }
          lVar5 = std::__cxx11::string::find_last_not_of(local_280,0x13653e);
          std::__cxx11::string::erase((ulong)local_280,lVar5 + 1);
          std::__cxx11::string::string((string *)&local_330,(string *)local_280);
          Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          setVertexName(this_01,&local_330,local_2b0);
          std::__cxx11::string::~string((string *)&local_330);
          poVar2 = std::operator<<((ostream *)&std::cout,"adding vertex name");
          poVar2 = std::operator<<(poVar2,(string *)local_280);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::string
                    ((string *)(newNeighbor.field_2._M_local_buf + 8),(string *)&graphIndex);
          Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          setVertexData(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&newNeighbor.field_2 + 8),local_2b0);
          std::__cxx11::string::~string((string *)(newNeighbor.field_2._M_local_buf + 8));
          poVar2 = std::operator<<((ostream *)&std::cout,"adding vertex data");
          poVar2 = std::operator<<(poVar2,(string *)&graphIndex);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_370,"",&local_371);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
          while( true ) {
            piVar4 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),(string *)local_258)
            ;
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
            local_48a = false;
            if (bVar1) {
              local_48a = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_258,"}");
            }
            if (local_48a == false) break;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_258,"adjacent:");
            if (bVar1) {
              lVar5 = std::__cxx11::string::find_last_not_of((char *)local_370,0x13653e);
              std::__cxx11::string::erase((ulong)local_370,lVar5 + 1);
              std::__cxx11::string::string((string *)&local_398,local_370);
              Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::addNeighbor(this_01,&local_398,local_2b0);
              std::__cxx11::string::~string((string *)&local_398);
              poVar2 = std::operator<<((ostream *)&std::cout,"adding neighbor");
              poVar2 = std::operator<<(poVar2,local_370);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::operator=(local_370,"");
            }
            else {
              std::operator+(&local_3b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_258," ");
              std::__cxx11::string::operator+=(local_370,(string *)&local_3b8);
              std::__cxx11::string::~string((string *)&local_3b8);
            }
          }
          local_2b0 = local_2b0 + 1;
          std::__cxx11::string::~string(local_370);
        }
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Graph --------------------------------");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      toString(&local_3d8,this_01);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_3d8);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_3d8);
      this->map = this_01;
      bVar1 = true;
      std::__cxx11::string::~string((string *)&graphIndex);
      std::__cxx11::string::~string((string *)local_280);
      std::__cxx11::string::~string((string *)local_258);
      std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    }
    else {
      bVar1 = false;
    }
  }
  return this->map;
}

Assistant:

Graph<string>* MapLoader::loadMap()
{
  //method to load the map file into a graph object

  bool result = false;

  while(!result)
  {

    if(fileIsValid())
    {
      //if the file was valid then we set up the graph object by reading all of the data in the file and assigning nodes
      cout << "Setting up the game board..." << endl;

      Graph<string>* graph = new Graph<string>(nodeCount);

      //we need to reopen the file

      ifstream input; //the input stream associated to out file
      input.open(filePath.c_str()); //try opening the file

      //we already know it is valid so we can start reading right away
      string line = "";
      string nodeName = "";
      string nodeType = "";
      int graphIndex = 0;

      //while we still have readable lines
      while(input >> line)
      {
        //first get the name of the node
        if(line == "@node")
        {
          //wipe the nodeName and nodeType clean
          nodeName = "";
          nodeType = "";

          //if the line is the node declaration
          //then go to the next line and the line after that, where the name field is
          input >> line;
          input >> line;

          //now that we are at the name field we read until we hit adjacent node
          while(input >> line && line != "type:")
          {
            nodeName = nodeName + line + " ";
          }

          //now we need to get the type of node that it is
          while(input >> line && line != "adjacent:")
          {
            nodeType = nodeType + line;
          }

          //since we add a space at the end, we need to trim the right side
          nodeName.erase(nodeName.find_last_not_of(" \n\r\t")+1);
          //now that we have the name of the node, we need to add it to our graph
          graph -> setVertexName(nodeName, graphIndex);
          cout << "adding vertex name" << nodeName << endl;
          graph -> setVertexData(nodeType, graphIndex);
          cout << "adding vertex data" << nodeType << endl;

          //now that we have added the name of the node we need to add every node it is adjacent to to its adjacency list

          string newNeighbor = ""; //the string that will hold the name of the new neighbor to the node

          //while we have not reached a closing brace, keep reading
          while(input >> line && line != "}")
          {
            //if the line contains the word adjacent, then skip that word
            if(line == "adjacent:")
            {
              newNeighbor.erase(newNeighbor.find_last_not_of(" \n\r\t")+1);
              graph -> addNeighbor(newNeighbor, graphIndex); //add the new neighbor
              cout << "adding neighbor" << newNeighbor << endl;
              newNeighbor = ""; //wipe the newNeighbor field and then continue the iteration
              continue;
            }

            else
            {
              newNeighbor += line + " ";
            }
          }

          graphIndex++;
        }
      }
      cout << "Graph --------------------------------" << endl;
      cout << graph->toString() << endl;
      map = graph;
      result = true;
    }

    else
    {
      //if the file was not valid then we need to try again
      result = false;
    }
  }

  return map;

}